

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O2

int CVmObject::get_prop_check_argc(vm_val_t *val,uint *argc,CVmNativeCodeDesc *desc)

{
  int iVar1;
  
  if (argc == (uint *)0x0) {
    val->typ = VM_NATIVE_CODE;
    (val->val).native_desc = desc;
    iVar1 = 1;
  }
  else {
    iVar1 = CVmNativeCodeDesc::args_ok(desc,*argc);
    if (iVar1 == 0) {
      err_throw(0x899);
    }
    *argc = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int get_prop_check_argc(vm_val_t *val, uint *argc,
                                   const CVmNativeCodeDesc *desc)
    {
        /* 
         *   if there's no 'argc', we can't execute the native code - we're
         *   simply being asked for a description of the method, not to
         *   evaluate its result 
         */
        if (argc == 0)
        {
            /* indicate a native code evaluation is required */
            val->set_native(desc);

            /* tell get_prop() to return without further work */
            return TRUE;
        }

        /* check the argument count - throw an error if out of range */
        if (!desc->args_ok(*argc))
            err_throw(VMERR_WRONG_NUM_OF_ARGS);

        /* everything's fine - consume the arguments */
        *argc = 0;

        /* tell get_prop() to proceed with the native evaluation */
        return FALSE;
    }